

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

_Bool tcg_resolve_relocs(TCGContext_conflict9 *s)

{
  tcg_insn_unit *value_00;
  _Bool _Var1;
  uintptr_t value;
  TCGRelocation *r;
  TCGLabel *l;
  TCGContext_conflict9 *s_local;
  
  r = (TCGRelocation *)(s->labels).sqh_first;
  do {
    if (r == (TCGRelocation *)0x0) {
      return true;
    }
    value_00 = r->ptr;
    for (value = r->addend; value != 0; value = *(uintptr_t *)value) {
      _Var1 = patch_reloc(*(tcg_insn_unit **)(value + 8),*(int *)(value + 0x18),(intptr_t)value_00,
                          *(intptr_t *)(value + 0x10));
      if (!_Var1) {
        return false;
      }
    }
    r = r[1].next.sqe_next;
  } while( true );
}

Assistant:

static bool tcg_resolve_relocs(TCGContext *s)
{
    TCGLabel *l;

    QSIMPLEQ_FOREACH(l, &s->labels, next) {
        TCGRelocation *r;
        uintptr_t value = l->u.value;

        QSIMPLEQ_FOREACH(r, &l->relocs, next) {
            if (!patch_reloc(r->ptr, r->type, value, r->addend)) {
                return false;
            }
        }
    }
    return true;
}